

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8_t * google::protobuf::io::CodedOutputStream::WriteVarint64ToArray
                    (uint64_t value,uint8_t *target)

{
  for (; 0x7f < value; value = value >> 7) {
    *target = (byte)value | 0x80;
    target = target + 1;
  }
  *target = (byte)value;
  return target + 1;
}

Assistant:

inline uint8_t* CodedOutputStream::WriteVarint64ToArray(uint64_t value,
                                                        uint8_t* target) {
  return EpsCopyOutputStream::UnsafeVarint(value, target);
}